

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyMarkStack(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined4 *puVar5;
  int local_34;
  int i;
  void **registers;
  void *candidate;
  void *stackStart;
  void **stackTop;
  Recycler *this_local;
  
  ppvVar3 = SavedRegisterState::GetRegisters(&this->savedThreadContext);
  amd64_SAVE_REGISTERS(ppvVar3);
  stackStart = SavedRegisterState::GetStackTop(&this->savedThreadContext);
  pvVar4 = GetStackBase();
  if (pvVar4 <= stackStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2180,"(stackStart > stackTop)","stackStart > stackTop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  for (; stackStart < pvVar4; stackStart = (void *)((long)stackStart + 8)) {
    VerifyMark(this,(void *)0x0,*stackStart);
  }
  ppvVar3 = SavedRegisterState::GetRegisters(&this->savedThreadContext);
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
    VerifyMark(this,(void *)0x0,ppvVar3[local_34]);
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkStack()
{
    SAVE_THREAD_CONTEXT();
    void ** stackTop = (void**) this->savedThreadContext.GetStackTop();

    void * stackStart = GetStackBase();
    Assert(stackStart > stackTop);

    for (;stackTop < stackStart; stackTop++)
    {
        void* candidate = *stackTop;
        VerifyMark(nullptr, candidate);
    }

    void** registers = this->savedThreadContext.GetRegisters();
    for (int i = 0; i < SavedRegisterState::NumRegistersToSave; i++)
    {
        VerifyMark(nullptr, registers[i]);
    }
}